

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhSetEmptyPage(lhpage *pPage)

{
  uchar *buf;
  sxu16 nb;
  int rc;
  sxu16 nByte;
  lhphdr *pHeader;
  uchar *zRaw;
  lhpage *pPage_local;
  
  buf = pPage->pRaw->zData;
  pPage_local._4_4_ = (*pPage->pHash->pIo->xWrite)(pPage->pRaw);
  if (pPage_local._4_4_ == 0) {
    SyBigEndianPack16(buf,0);
    (pPage->sHdr).iFree = 0xc;
    SyBigEndianPack16(buf + 2,0xc);
    SyBigEndianPack64(buf + 4,0);
    SyBigEndianPack16(buf + 0xc,0);
    nb = (short)pPage->pHash->iPageSize - 0xc;
    SyBigEndianPack16(buf + 0xe,nb);
    pPage->nFree = nb;
    (*pPage->pHash->pIo->xDontMkHot)(pPage->pRaw);
    pPage_local._4_4_ = 0;
  }
  return pPage_local._4_4_;
}

Assistant:

static int lhSetEmptyPage(lhpage *pPage)
{
	unsigned char *zRaw = pPage->pRaw->zData;
	lhphdr *pHeader = &pPage->sHdr;
	sxu16 nByte;
	int rc;
	/* Acquire a writer lock */
	rc = pPage->pHash->pIo->xWrite(pPage->pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Offset of the first cell */
	SyBigEndianPack16(zRaw,0);
	zRaw += 2;
	/* Offset of the first free block */
	pHeader->iFree = L_HASH_PAGE_HDR_SZ;
	SyBigEndianPack16(zRaw,L_HASH_PAGE_HDR_SZ);
	zRaw += 2;
	/* Slave page number */
	SyBigEndianPack64(zRaw,0);
	zRaw += 8;
	/* Fill the free block */
	SyBigEndianPack16(zRaw,0); /* Offset of the next free block */
	zRaw += 2;
	nByte = (sxu16)L_HASH_MX_FREE_SPACE(pPage->pHash->iPageSize);
	SyBigEndianPack16(zRaw,nByte);
	pPage->nFree = nByte;
	/* Do not add this page to the hot dirty list */
	pPage->pHash->pIo->xDontMkHot(pPage->pRaw);
	return UNQLITE_OK;
}